

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionManager.cpp
# Opt level: O2

CK_RV __thiscall
SessionManager::openSession
          (SessionManager *this,Slot *slot,CK_FLAGS flags,CK_VOID_PTR pApplication,CK_NOTIFY notify,
          CK_SESSION_HANDLE_PTR phSession)

{
  pointer ppSVar1;
  bool bVar2;
  Token *this_00;
  Session *this_01;
  CK_SESSION_HANDLE CVar3;
  CK_RV CVar4;
  Session *session;
  SessionManager *local_50;
  CK_NOTIFY local_48;
  MutexLocker lock;
  
  if (phSession == (CK_SESSION_HANDLE_PTR)0x0) {
    return 7;
  }
  if (slot == (Slot *)0x0) {
    return 3;
  }
  if ((flags & 4) == 0) {
    return 0xb4;
  }
  local_50 = this;
  local_48 = notify;
  MutexLocker::MutexLocker(&lock,this->sessionsMutex);
  this_00 = Slot::getToken(slot);
  if (this_00 == (Token *)0x0) {
    CVar4 = 0xe0;
  }
  else {
    bVar2 = Token::isInitialized(this_00);
    CVar4 = 0xe1;
    if (bVar2) {
      if ((flags & 2) == 0) {
        bVar2 = Token::isSOLoggedIn(this_00);
        CVar4 = 0xb8;
        if (bVar2) goto LAB_001693c9;
      }
      this_01 = (Session *)operator_new(0xa8);
      Session::Session(this_01,slot,SUB41(((uint)flags & 2) >> 1,0),pApplication,local_48);
      ppSVar1 = (local_50->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      for (CVar3 = 1; session = this_01,
          CVar3 - ((long)(local_50->sessions).
                         super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3) != 1;
          CVar3 = CVar3 + 1) {
        if (ppSVar1[CVar3 - 1] == (Session *)0x0) {
          ppSVar1[CVar3 - 1] = this_01;
          Session::setHandle(this_01,CVar3);
          CVar3 = Session::getHandle(this_01);
          goto LAB_001693c3;
        }
      }
      std::vector<Session_*,_std::allocator<Session_*>_>::push_back(&local_50->sessions,&session);
      Session::setHandle(session,(long)(local_50->sessions).
                                       super__Vector_base<Session_*,_std::allocator<Session_*>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                 (long)(local_50->sessions).
                                       super__Vector_base<Session_*,_std::allocator<Session_*>_>.
                                       _M_impl.super__Vector_impl_data._M_start >> 3);
      CVar3 = Session::getHandle(session);
LAB_001693c3:
      *phSession = CVar3;
      CVar4 = 0;
    }
  }
LAB_001693c9:
  MutexLocker::~MutexLocker(&lock);
  return CVar4;
}

Assistant:

CK_RV SessionManager::openSession
(
	Slot* slot,
	CK_FLAGS flags,
	CK_VOID_PTR pApplication,
	CK_NOTIFY notify,
	CK_SESSION_HANDLE_PTR phSession
)
{
	if (phSession == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (slot == NULL) return CKR_SLOT_ID_INVALID;
	if ((flags & CKF_SERIAL_SESSION) == 0) return CKR_SESSION_PARALLEL_NOT_SUPPORTED;

	// Lock access to the vector
	MutexLocker lock(sessionsMutex);

	// Get the token
	Token* token = slot->getToken();
	if (token == NULL) return CKR_TOKEN_NOT_PRESENT;
	if (!token->isInitialized()) return CKR_TOKEN_NOT_RECOGNIZED;

	// Can not open a Read-Only session when in SO mode
	if ((flags & CKF_RW_SESSION) == 0 && token->isSOLoggedIn()) return CKR_SESSION_READ_WRITE_SO_EXISTS;

	// TODO: Do we want to check for maximum number of sessions?
	// return CKR_SESSION_COUNT

	// Create the session
	bool rwSession = ((flags & CKF_RW_SESSION) == CKF_RW_SESSION) ? true : false;
	Session* session = new Session(slot, rwSession, pApplication, notify);

	// First fill any empty spot in the list
	for (size_t i = 0; i < sessions.size(); i++)
	{
		if (sessions[i] != NULL)
		{
			continue;
		}

		sessions[i] = session;
		session->setHandle(i + 1);
		*phSession = session->getHandle();

		return CKR_OK;
	}

	// Or add it to the end
	sessions.push_back(session);
	session->setHandle(sessions.size());
	*phSession = session->getHandle();

	return CKR_OK;
}